

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O0

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::set_status
          (ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,
          VertexHandle _vh,StatusInfo *_status)

{
  bool bVar1;
  StatusInfo *pSVar2;
  value_type_conflict1 *in_RDX;
  ArrayKernel *in_stack_00000010;
  ArrayKernel *in_stack_ffffffffffffffc8;
  
  bVar1 = ArrayKernel::has_vertex_status((ArrayKernel *)0x1bb095);
  if (!bVar1) {
    ArrayKernel::request_vertex_status(in_stack_00000010);
  }
  pSVar2 = ArrayKernel::status(in_stack_ffffffffffffffc8,(BaseHandle)(int)((ulong)in_RDX >> 0x20));
  pSVar2->status_ = *in_RDX;
  return;
}

Assistant:

virtual void set_status(VertexHandle _vh, const OpenMesh::Attributes::StatusInfo& _status) override
  {
    if (!mesh_.has_vertex_status())
      mesh_.request_vertex_status();
    mesh_.status(_vh) = _status;
  }